

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  float fVar1;
  uint uVar2;
  stbi_uc *psVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  long lVar8;
  stbi_uc *psVar9;
  long in_FS_OFFSET;
  float fVar10;
  double dVar11;
  
  if (data != (float *)0x0) {
    psVar3 = (stbi_uc *)stbi__malloc_mad3(x,y,comp,0);
    if (psVar3 != (stbi_uc *)0x0) {
      if (0 < y * x) {
        uVar2 = ((comp & 1U) + comp) - 1;
        lVar8 = (long)comp;
        uVar6 = 0;
        pfVar7 = data;
        psVar9 = psVar3;
        do {
          uVar5 = 0;
          if (0 < (int)uVar2) {
            uVar5 = 0;
            do {
              dVar11 = pow((double)(pfVar7[uVar5] * stbi__h2l_scale_i),(double)stbi__h2l_gamma_i);
              fVar10 = (float)dVar11 * 255.0 + 0.5;
              fVar1 = 0.0;
              if (0.0 <= fVar10) {
                fVar1 = fVar10;
              }
              fVar10 = 255.0;
              if (fVar1 <= 255.0) {
                fVar10 = fVar1;
              }
              psVar9[uVar5] = (stbi_uc)(int)fVar10;
              uVar5 = uVar5 + 1;
            } while (uVar2 != uVar5);
          }
          if ((int)uVar5 < comp) {
            lVar4 = (long)(int)uVar5 + uVar6 * lVar8;
            fVar10 = data[lVar4] * 255.0 + 0.5;
            fVar1 = 0.0;
            if (0.0 <= fVar10) {
              fVar1 = fVar10;
            }
            fVar10 = 255.0;
            if (fVar1 <= 255.0) {
              fVar10 = fVar1;
            }
            psVar3[lVar4] = (stbi_uc)(int)fVar10;
          }
          uVar6 = uVar6 + 1;
          pfVar7 = pfVar7 + lVar8;
          psVar9 = psVar9 + lVar8;
        } while (uVar6 != (uint)(y * x));
      }
      free(data);
      return psVar3;
    }
    free(data);
    *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output;
   if (!data) return NULL;
   output = (stbi_uc *) stbi__malloc_mad3(x, y, comp, 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}